

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O3

void OpenMD::SquareMatrix3<double>::diagonalize
               (SquareMatrix3<double> *a,Vector3<double> *w,SquareMatrix3<double> *v)

{
  undefined8 *puVar1;
  double *pdVar2;
  double (*padVar3) [3];
  double dVar4;
  uint uVar5;
  bool bVar6;
  uint i_1;
  uint uVar7;
  undefined1 *puVar8;
  double *pdVar9;
  uint i;
  long lVar10;
  ulong uVar11;
  long lVar12;
  double *pdVar13;
  double (*padVar14) [3];
  ulong uVar15;
  int iVar16;
  long lVar17;
  double tmp;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  bool bVar24;
  undefined8 uVar25;
  Vector3<double> v_k;
  SquareMatrix<double,_3> m;
  double local_b8 [4];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined8 local_58;
  double local_48;
  double dStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  double dStack_20;
  ulong uVar18;
  long lVar23;
  
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  SquareMatrix<double,_3>::jacobi
            (&a->super_SquareMatrix<double,_3>,&w->super_Vector<double,_3U>,
             &v->super_SquareMatrix<double,_3>);
  dVar19 = (w->super_Vector<double,_3U>).data_[0];
  if (((dVar19 != (w->super_Vector<double,_3U>).data_[1]) ||
      (pdVar9 = (w->super_Vector<double,_3U>).data_ + 2, dVar19 != *pdVar9)) ||
     (NAN(dVar19) || NAN(*pdVar9))) {
    pdVar9 = (double *)local_98;
    local_68 = ZEXT816(0);
    local_78 = ZEXT816(0);
    local_88 = ZEXT816(0);
    local_98 = ZEXT816(0);
    local_58 = 0;
    lVar10 = 0;
    padVar14 = (double (*) [3])v;
    do {
      lVar12 = 0;
      pdVar13 = pdVar9;
      do {
        *pdVar13 = (((SquareMatrix<double,_3> *)*padVar14)->super_RectMatrix<double,_3U,_3U>).data_
                   [0][lVar12];
        lVar12 = lVar12 + 1;
        pdVar13 = pdVar13 + 3;
      } while (lVar12 != 3);
      lVar10 = lVar10 + 1;
      pdVar9 = pdVar9 + 1;
      padVar14 = padVar14 + 1;
    } while (lVar10 != 3);
    lVar10 = 0;
    do {
      *(undefined8 *)
       ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar10 + 0x10) = *(undefined8 *)(local_88 + lVar10);
      uVar25 = *(undefined8 *)(local_98 + lVar10 + 8);
      puVar1 = (undefined8 *)
               ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
               lVar10);
      *puVar1 = *(undefined8 *)(local_98 + lVar10);
      puVar1[1] = uVar25;
      lVar10 = lVar10 + 0x18;
    } while (lVar10 != 0x48);
    pdVar9 = (double *)v;
    uVar11 = 0;
    do {
      uVar18 = uVar11;
      pdVar13 = pdVar9;
      iVar16 = (int)uVar18;
      if (iVar16 == 3) {
        dVar20 = ABS((v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0]
                    );
        dVar21 = ABS((v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0]
                    );
        dVar19 = dVar21;
        if (dVar21 <= dVar20) {
          dVar19 = dVar20;
        }
        uVar7 = 2;
        if (ABS((v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0]) <=
            dVar19) {
          uVar7 = (uint)(dVar20 < dVar21);
        }
        if (uVar7 != 0) {
          dVar19 = (w->super_Vector<double,_3U>).data_[uVar7];
          (w->super_Vector<double,_3U>).data_[uVar7] = (w->super_Vector<double,_3U>).data_[0];
          (w->super_Vector<double,_3U>).data_[0] = dVar19;
          lVar10 = 0;
          do {
            dVar19 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                     [uVar7][lVar10];
            (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar7][lVar10]
                 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                   [lVar10];
            (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar10] =
                 dVar19;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
        }
        if (ABS((v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1]) <
            ABS((v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1])) {
          dVar19 = (w->super_Vector<double,_3U>).data_[1];
          (w->super_Vector<double,_3U>).data_[1] = (w->super_Vector<double,_3U>).data_[2];
          (w->super_Vector<double,_3U>).data_[2] = dVar19;
          lVar10 = -0x18;
          do {
            uVar25 = *(undefined8 *)
                      ((long)v[1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                             data_[0] + lVar10);
            *(undefined8 *)
             ((long)v[1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
             lVar10) = *(undefined8 *)
                        ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                               data_[2] + lVar10);
            *(undefined8 *)
             ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2] +
             lVar10) = uVar25;
            lVar10 = lVar10 + 8;
          } while (lVar10 != 0);
        }
        lVar10 = 0;
        bVar24 = true;
        do {
          bVar6 = bVar24;
          pdVar9 = (double *)
                   ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                   + lVar10 * 0x20);
          if (*pdVar9 <= 0.0 && *pdVar9 != 0.0) {
            padVar14 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                       lVar10;
            dVar19 = (*padVar14)[1];
            padVar3 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                      lVar10;
            (*padVar3)[0] = -(*padVar14)[0];
            (*padVar3)[1] = -dVar19;
            (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[lVar10][2] =
                 -(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[lVar10]
                  [2];
          }
          lVar10 = 1;
          bVar24 = false;
        } while (bVar6);
        dVar19 = determinant(v);
        if (dVar19 < 0.0) {
          dVar19 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1];
          (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0] =
               -(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0];
          (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1] = -dVar19;
          (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2] =
               -(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2];
        }
        pdVar9 = (double *)local_98;
        local_68 = ZEXT816(0);
        local_78 = ZEXT816(0);
        local_88 = ZEXT816(0);
        local_98 = ZEXT816(0);
        local_58 = 0;
        lVar10 = 0;
        padVar14 = (double (*) [3])v;
        do {
          lVar12 = 0;
          pdVar13 = pdVar9;
          do {
            *pdVar13 = (((SquareMatrix<double,_3> *)*padVar14)->super_RectMatrix<double,_3U,_3U>).
                       data_[0][lVar12];
            lVar12 = lVar12 + 1;
            pdVar13 = pdVar13 + 3;
          } while (lVar12 != 3);
          lVar10 = lVar10 + 1;
          pdVar9 = pdVar9 + 1;
          padVar14 = padVar14 + 1;
        } while (lVar10 != 3);
        lVar10 = 0;
        do {
          *(undefined8 *)
           ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
           lVar10 + 0x10) = *(undefined8 *)(local_88 + lVar10);
          uVar25 = *(undefined8 *)(local_98 + lVar10 + 8);
          puVar1 = (undefined8 *)
                   ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                          [0] + lVar10);
          *puVar1 = *(undefined8 *)(local_98 + lVar10);
          puVar1[1] = uVar25;
          lVar10 = lVar10 + 0x18;
        } while (lVar10 != 0x48);
        return;
      }
      uVar11 = uVar18 + 1;
      uVar15 = uVar11 & 0xffffffff;
      if (iVar16 == 2) {
        uVar15 = 0;
      }
      dVar19 = (w->super_Vector<double,_3U>).data_[uVar15];
      uVar7 = iVar16 - 1;
      if (iVar16 == 0) {
        uVar7 = 2;
      }
      pdVar9 = pdVar13 + 3;
      pdVar2 = (w->super_Vector<double,_3U>).data_ + uVar7;
    } while ((dVar19 != *pdVar2) || (NAN(dVar19) || NAN(*pdVar2)));
    dVar19 = ABS(*pdVar13);
    uVar7 = 0;
    lVar10 = -2;
    do {
      dVar20 = ABS(pdVar9[lVar10]);
      uVar5 = (int)lVar10 + 3;
      if (ABS(pdVar9[lVar10]) <= dVar19) {
        dVar20 = dVar19;
        uVar5 = uVar7;
      }
      uVar7 = uVar5;
      dVar19 = dVar20;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0);
    uVar15 = (ulong)uVar7;
    if (uVar7 + 1 != (int)uVar11) {
      dVar19 = (w->super_Vector<double,_3U>).data_[uVar15];
      (w->super_Vector<double,_3U>).data_[uVar15] = (w->super_Vector<double,_3U>).data_[uVar18];
      (w->super_Vector<double,_3U>).data_[uVar18] = dVar19;
      lVar10 = 0;
      do {
        dVar19 = *pdVar13;
        *pdVar13 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar15]
                   [lVar10];
        (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar15][lVar10] =
             dVar19;
        lVar10 = lVar10 + 1;
        pdVar13 = pdVar13 + 1;
      } while (lVar10 != 3);
    }
    pdVar9 = (double *)
             ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
             uVar15 * 0x20);
    dVar19 = 0.0;
    if (*pdVar9 <= 0.0 && *pdVar9 != 0.0) {
      padVar14 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + uVar15;
      dVar20 = (*padVar14)[1];
      padVar3 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + uVar15;
      (*padVar3)[0] = -(*padVar14)[0];
      (*padVar3)[1] = -dVar20;
      (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar15][2] =
           -(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar15][2];
    }
    uVar11 = (ulong)(((int)(uVar7 + 1) / 3) * -3 + uVar7 + 1);
    padVar14 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + uVar11;
    (*padVar14)[0] = 0.0;
    (*padVar14)[1] = 0.0;
    (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar11][2] = 0.0;
    *(undefined8 *)
     ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
     uVar11 * 0x20) = 0x3ff0000000000000;
    local_38 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar15][0];
    pdVar9 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar15] + 1;
    local_28 = *pdVar9;
    dStack_20 = pdVar9[1];
    dVar20 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar11][0];
    pdVar9 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar11] + 1;
    dVar21 = *pdVar9;
    dVar4 = pdVar9[1];
    local_b8[0] = dVar4 * local_28 - dVar21 * dStack_20;
    local_b8[1] = dVar20 * dStack_20 - dVar4 * local_38;
    local_b8[2] = local_38 * dVar21 - dVar20 * local_28;
    lVar10 = 0;
    do {
      dVar19 = dVar19 + local_b8[lVar10] * local_b8[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    local_48 = dStack_20;
    dStack_40 = local_38;
    if (dVar19 < 0.0) {
      uStack_30 = 0;
      dVar19 = sqrt(dVar19);
    }
    else {
      dVar19 = SQRT(dVar19);
    }
    lVar10 = 0;
    do {
      local_b8[lVar10] = local_b8[lVar10] / dVar19;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    padVar14 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + uVar11;
    (*padVar14)[0] = local_48 * local_b8[1] - local_28 * local_b8[2];
    (*padVar14)[1] = dStack_40 * local_b8[2] - dStack_20 * local_b8[0];
    (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar11][2] =
         local_28 * local_b8[0] - local_38 * local_b8[1];
    uVar7 = (int)(uVar7 + 2) % 3;
    (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar7][2] =
         local_b8[2];
    padVar14 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + uVar7;
    (*padVar14)[0] = local_b8[0];
    (*padVar14)[1] = local_b8[1];
    pdVar9 = (double *)local_98;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_58 = 0;
    lVar10 = 0;
    padVar14 = (double (*) [3])v;
    do {
      lVar12 = 0;
      pdVar13 = pdVar9;
      do {
        *pdVar13 = (((SquareMatrix<double,_3> *)*padVar14)->super_RectMatrix<double,_3U,_3U>).data_
                   [0][lVar12];
        lVar12 = lVar12 + 1;
        pdVar13 = pdVar13 + 3;
      } while (lVar12 != 3);
      lVar10 = lVar10 + 1;
      pdVar9 = pdVar9 + 1;
      padVar14 = padVar14 + 1;
    } while (lVar10 != 3);
    lVar10 = 0;
    do {
      *(undefined8 *)
       ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar10 + 0x10) = *(undefined8 *)(local_88 + lVar10);
      uVar25 = *(undefined8 *)(local_98 + lVar10 + 8);
      puVar1 = (undefined8 *)
               ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
               lVar10);
      *puVar1 = *(undefined8 *)(local_98 + lVar10);
      puVar1[1] = uVar25;
      lVar10 = lVar10 + 0x18;
    } while (lVar10 != 0x48);
  }
  else {
    puVar8 = local_98 + 8;
    local_68 = ZEXT816(0);
    local_78 = ZEXT816(0);
    local_88 = ZEXT816(0);
    local_98 = ZEXT816(0);
    local_58 = 0;
    lVar10 = 0;
    lVar12 = 0;
    do {
      lVar17 = 0;
      auVar22 = _DAT_00293290;
      do {
        bVar24 = SUB164(auVar22 ^ _DAT_002932a0,4) == -0x80000000 &&
                 SUB164(auVar22 ^ _DAT_002932a0,0) < -0x7ffffffd;
        if (bVar24) {
          uVar25 = 0x3ff0000000000000;
          if (lVar10 != lVar17) {
            uVar25 = 0;
          }
          *(undefined8 *)(puVar8 + lVar17 + -8) = uVar25;
        }
        if (bVar24) {
          uVar25 = 0x3ff0000000000000;
          if (lVar10 + -8 != lVar17) {
            uVar25 = 0;
          }
          *(undefined8 *)(puVar8 + lVar17) = uVar25;
        }
        lVar23 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 2;
        auVar22._8_8_ = lVar23 + 2;
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0x20);
      lVar12 = lVar12 + 1;
      lVar10 = lVar10 + 8;
      puVar8 = puVar8 + 0x18;
    } while (lVar12 != 3);
    lVar10 = 0;
    do {
      *(undefined8 *)
       ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar10 + 0x10) = *(undefined8 *)(local_88 + lVar10);
      uVar25 = *(undefined8 *)(local_98 + lVar10 + 8);
      puVar1 = (undefined8 *)
               ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
               lVar10);
      *puVar1 = *(undefined8 *)(local_98 + lVar10);
      puVar1[1] = uVar25;
      lVar10 = lVar10 + 0x18;
    } while (lVar10 != 0x48);
  }
  return;
}

Assistant:

void SquareMatrix3<Real>::diagonalize(SquareMatrix3<Real>& a,
                                        Vector3<Real>& w,
                                        SquareMatrix3<Real>& v) {
    int i, j, k, maxI;
    Real tmp, maxVal;
    Vector3<Real> v_maxI, v_k, v_j;

    // diagonalize using Jacobi
    SquareMatrix3<Real>::jacobi(a, w, v);
    // if all the eigenvalues are the same, return identity matrix
    if (w[0] == w[1] && w[0] == w[2]) {
      v = SquareMatrix3<Real>::identity();
      return;
    }

    // transpose temporarily, it makes it easier to sort the eigenvectors
    v = v.transpose();

    // if two eigenvalues are the same, re-orthogonalize to optimally line
    // up the eigenvectors with the x, y, and z axes
    for (i = 0; i < 3; i++) {
      if (w((i + 1) % 3) == w((i + 2) % 3)) {  // two eigenvalues are the same
        // find maximum element of the independant eigenvector
        maxVal = fabs(v(i, 0));
        maxI   = 0;
        for (j = 1; j < 3; j++) {
          if (maxVal < (tmp = fabs(v(i, j)))) {
            maxVal = tmp;
            maxI   = j;
          }
        }

        // swap the eigenvector into its proper position
        if (maxI != i) {
          tmp     = w(maxI);
          w(maxI) = w(i);
          w(i)    = tmp;

          v.swapRow(i, maxI);
        }
        // maximum element of eigenvector should be positive
        if (v(maxI, maxI) < 0) {
          v(maxI, 0) = -v(maxI, 0);
          v(maxI, 1) = -v(maxI, 1);
          v(maxI, 2) = -v(maxI, 2);
        }

        // re-orthogonalize the other two eigenvectors
        j = (maxI + 1) % 3;
        k = (maxI + 2) % 3;

        v(j, 0) = 0.0;
        v(j, 1) = 0.0;
        v(j, 2) = 0.0;
        v(j, j) = 1.0;

        /** @todo */
        v_maxI = v.getRow(maxI);
        v_j    = v.getRow(j);
        v_k    = cross(v_maxI, v_j);
        v_k.normalize();
        v_j = cross(v_k, v_maxI);
        v.setRow(j, v_j);
        v.setRow(k, v_k);

        // transpose vectors back to columns
        v = v.transpose();
        return;
      }
    }

    // the three eigenvalues are different, just sort the eigenvectors
    // to align them with the x, y, and z axes

    // find the vector with the largest x element, make that vector
    // the first vector
    maxVal = fabs(v(0, 0));
    maxI   = 0;
    for (i = 1; i < 3; i++) {
      if (maxVal < (tmp = fabs(v(i, 0)))) {
        maxVal = tmp;
        maxI   = i;
      }
    }

    // swap eigenvalue and eigenvector
    if (maxI != 0) {
      tmp     = w(maxI);
      w(maxI) = w(0);
      w(0)    = tmp;
      v.swapRow(maxI, 0);
    }
    // do the same for the y element
    if (fabs(v(1, 1)) < fabs(v(2, 1))) {
      tmp  = w(2);
      w(2) = w(1);
      w(1) = tmp;
      v.swapRow(2, 1);
    }

    // ensure that the sign of the eigenvectors is correct
    for (i = 0; i < 2; i++) {
      if (v(i, i) < 0) {
        v(i, 0) = -v(i, 0);
        v(i, 1) = -v(i, 1);
        v(i, 2) = -v(i, 2);
      }
    }

    // set sign of final eigenvector to ensure that determinant is positive
    if (v.determinant() < 0) {
      v(2, 0) = -v(2, 0);
      v(2, 1) = -v(2, 1);
      v(2, 2) = -v(2, 2);
    }

    // transpose the eigenvectors back again
    v = v.transpose();
    return;
  }